

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool seen_tval(wchar_t tval)

{
  object_kind *poVar1;
  object_kind *kind;
  wchar_t i;
  wchar_t tval_local;
  
  kind._4_4_ = 1;
  while( true ) {
    if ((int)(uint)z_info->k_max <= kind._4_4_) {
      return false;
    }
    poVar1 = k_info + kind._4_4_;
    if (((poVar1->name != (char *)0x0) && ((poVar1->everseen & 1U) != 0)) && (poVar1->tval == tval))
    break;
    kind._4_4_ = kind._4_4_ + 1;
  }
  return true;
}

Assistant:

static bool seen_tval(int tval)
{
	int i;

	for (i = 1; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Skip empty objects, unseen objects, and incorrect tvals */
		if (!kind->name) continue;
		if (!kind->everseen) continue;
		if (kind->tval != tval) continue;

		 return true;
	}


	return false;
}